

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O0

uint sfc::max_tile_count_for_mode(Mode mode)

{
  uint local_c;
  Mode mode_local;
  
  switch(mode) {
  case snes:
  case gba:
  case wsc:
  case wsc_packed:
    local_c = 0x400;
    break;
  case snes_mode7:
  case gb:
  case gba_affine:
    local_c = 0x100;
    break;
  case gbc:
  case ws:
  case ngp:
  case ngpc:
  case sms:
  case gg:
    local_c = 0x200;
    break;
  case md:
  case pce:
    local_c = 0x800;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

constexpr unsigned max_tile_count_for_mode(Mode mode) {
  switch (mode) {
  case Mode::snes_mode7:
  case Mode::gb:
  case Mode::gba_affine:
    return 256;
  case Mode::gbc:
  case Mode::ws:
  case Mode::ngp:
  case Mode::ngpc:
  case Mode::sms:
  case Mode::gg:
    return 512;
  case Mode::snes:
  case Mode::gba:
  case Mode::wsc:
  case Mode::wsc_packed:
    return 1024;
  case Mode::md:
  case Mode::pce:
    return 2048;
  default:
    return 0;
  }
}